

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O2

sc_uint_base * __thiscall sc_dt::sc_uint_base::operator=(sc_uint_base *this,sc_bv_base *a)

{
  byte bVar1;
  uint uVar2;
  sc_digit *psVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = this->m_len;
  uVar4 = a->m_len;
  if ((int)uVar2 < a->m_len) {
    uVar4 = uVar2;
  }
  psVar3 = a->m_data;
  uVar6 = this->m_val;
  uVar7 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    uVar8 = uVar6 | 1L << (uVar7 & 0x3f);
    uVar6 = uVar6 & ~(1L << (uVar7 & 0x3f));
    if ((psVar3[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
      uVar6 = uVar8;
    }
    this->m_val = uVar6;
  }
  for (; (long)uVar5 < (long)(int)uVar2; uVar5 = uVar5 + 1) {
    uVar6 = uVar6 & ~(1L << (uVar5 & 0x3f));
    this->m_val = uVar6;
  }
  bVar1 = (byte)this->m_ulen;
  this->m_val = (uVar6 << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
  return this;
}

Assistant:

sc_uint_base&
sc_uint_base::operator = ( const sc_bv_base& a )
{
    int minlen = sc_min( m_len, a.length() );
    int i = 0;
    for( ; i < minlen; ++ i ) {
	set( i, a.get_bit( i ) );
    }
    for( ; i < m_len; ++ i ) {
	// zero extension
	set( i, 0 );
    }
    extend_sign();
    return *this;
}